

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O3

int run_test_fs_copyfile(void)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  char *req_00;
  ulong uVar5;
  uv_fs_t *req_01;
  uv_fs_t *puVar6;
  code *pcVar7;
  char *unaff_R12;
  code *pcVar8;
  char *unaff_R15;
  code *name;
  int64_t eval_b;
  int64_t eval_a;
  char src [14];
  uv_fs_t req;
  undefined1 auStack_5d8 [120];
  long lStack_560;
  long lStack_530;
  ulong uStack_420;
  char *pcStack_418;
  code *pcStack_410;
  code *pcStack_408;
  undefined8 uStack_400;
  undefined1 auStack_3f0 [16];
  undefined1 auStack_3e0 [440];
  uv_fs_t *puStack_228;
  char *pcStack_220;
  undefined1 local_1f8 [8];
  undefined1 local_1f0 [8];
  undefined6 local_1e8;
  undefined2 uStack_1e2;
  undefined6 uStack_1e0;
  uv_fs_t local_1d8;
  
  req_01 = (uv_fs_t *)local_1f8;
  uStack_1e0 = 0x6372735f65;
  local_1e8._0_4_ = 0x74736574;
  local_1e8._4_2_ = 0x665f;
  uStack_1e2 = 0x6c69;
  req_00 = (char *)uv_default_loop();
  iVar3 = uv_fs_copyfile(0,local_1f0 + 0x18,local_1f0 + 8,"test_file_dst",0xffffffff,0);
  if (iVar3 == -0x16) {
    uv_fs_req_cleanup(local_1f0 + 0x18);
    unaff_R15 = local_1f0 + 8;
    unlink(unaff_R15);
    unaff_R12 = "test_file_dst";
    unlink("test_file_dst");
    iVar3 = uv_fs_copyfile(0,local_1f0 + 0x18,unaff_R15,"test_file_dst",0,0);
    if (local_1d8.result != 0xfffffffffffffffe) goto LAB_00158cdc;
    if (iVar3 != -2) goto LAB_00158ce1;
    uv_fs_req_cleanup(local_1f0 + 0x18);
    iVar3 = uv_fs_stat(0,local_1f0 + 0x18,"test_file_dst",0);
    if (iVar3 == 0) goto LAB_00158ce6;
    uv_fs_req_cleanup(local_1f0 + 0x18);
    unaff_R15 = local_1f0 + 8;
    touch_file(unaff_R15,0xc);
    iVar3 = uv_fs_copyfile(0,local_1f0 + 0x18,unaff_R15,unaff_R15,0,0);
    if (iVar3 != 0) goto LAB_00158ceb;
    uv_fs_req_cleanup(local_1f0 + 0x18);
    iVar3 = uv_fs_stat(0,local_1f0 + 0x18,local_1f0 + 8,0);
    local_1f0 = (undefined1  [8])(long)iVar3;
    local_1f8 = (undefined1  [8])0x0;
    if (local_1f0 != (undefined1  [8])0x0) goto LAB_00158cf0;
    local_1f0 = (undefined1  [8])local_1d8.statbuf.st_size;
    local_1f8 = (undefined1  [8])0xc;
    if ((void *)local_1d8.statbuf.st_size != (void *)0xc) goto LAB_00158cfd;
    req_01 = (uv_fs_t *)(local_1f0 + 0x18);
    uv_fs_req_cleanup(req_01);
    unlink(local_1f0 + 8);
    unaff_R15 = "test_file_dst";
    unlink("test_file_dst");
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,"test/fixtures/load_error.node","test_file_dst",0,0);
    if (iVar3 != 0) goto LAB_00158d0a;
    req_01 = (uv_fs_t *)(local_1f0 + 0x18);
    handle_result(req_01);
    unaff_R15 = "test_file_dst";
    unlink("test_file_dst");
    unaff_R12 = local_1f0 + 8;
    touch_file(unaff_R12,0);
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,unaff_R12,"test_file_dst",0,0);
    if (iVar3 != 0) goto LAB_00158d0f;
    req_01 = (uv_fs_t *)(local_1f0 + 0x18);
    handle_result(req_01);
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,"test/fixtures/load_error.node","test_file_dst",0,0);
    if (iVar3 != 0) goto LAB_00158d14;
    req_01 = (uv_fs_t *)(local_1f0 + 0x18);
    handle_result(req_01);
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,"test/fixtures/load_error.node","test_file_dst",1,0);
    name = (code *)unaff_R15;
    if (iVar3 != -0x11) goto LAB_00158d19;
    req_01 = (uv_fs_t *)(local_1f0 + 0x18);
    uv_fs_req_cleanup(req_01);
    name = (code *)(local_1f0 + 8);
    touch_file((char *)name,1);
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,name,"test_file_dst",0,0);
    if (iVar3 != 0) goto LAB_00158d1e;
    req_01 = (uv_fs_t *)(local_1f0 + 0x18);
    handle_result(req_01);
    unlink("test_file_dst");
    unaff_R12 = local_1f0 + 8;
    touch_file(unaff_R12,0x2000);
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,unaff_R12,"test_file_dst",0,0);
    name = (code *)"test_file_dst";
    if (iVar3 != 0) goto LAB_00158d23;
    req_01 = (uv_fs_t *)(local_1f0 + 0x18);
    handle_result(req_01);
    name = handle_result;
    unlink(local_1f0 + 8);
    unaff_R12 = "test_file_dst";
    unlink("test_file_dst");
    puVar6 = (uv_fs_t *)req_00;
    iVar3 = uv_fs_copyfile(req_00,req_01,"test/fixtures/load_error.node","test_file_dst",0,
                           handle_result);
    if (iVar3 != 0) goto LAB_00158d28;
    if (result_check_count != 5) goto LAB_00158d2d;
    req_01 = (uv_fs_t *)0x0;
    puVar6 = (uv_fs_t *)req_00;
    uv_run(req_00);
    if (result_check_count != 6) goto LAB_00158d32;
    unlink("test_file_dst");
    req_01 = (uv_fs_t *)(local_1f0 + 0x18);
    puVar6 = (uv_fs_t *)req_00;
    iVar3 = uv_fs_copyfile(req_00,req_01,"test/fixtures/load_error.node","test_file_dst",0xffffffff,
                           fail_cb);
    if (iVar3 != -0x16) goto LAB_00158d37;
    uv_run(req_00,0);
    req_00 = "test_file_dst";
    unlink("test_file_dst");
    req_01 = (uv_fs_t *)(local_1f0 + 0x18);
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,"test/fixtures/load_error.node","test_file_dst",2,0);
    if (iVar3 != 0) goto LAB_00158d3c;
    req_00 = local_1f0 + 0x18;
    handle_result((uv_fs_t *)req_00);
    unlink("test_file_dst");
    puVar6 = (uv_fs_t *)0x0;
    req_01 = (uv_fs_t *)req_00;
    iVar3 = uv_fs_copyfile(0,req_00,"test/fixtures/load_error.node","test_file_dst",4,0);
    if (0 < iVar3) goto LAB_00158d41;
    if (iVar3 == 0) {
      handle_result((uv_fs_t *)(local_1f0 + 0x18));
    }
    req_00 = "test_file_dst";
    unlink("test_file_dst");
    touch_file("test_file_dst",0);
    chmod("test_file_dst",0x124);
    req_01 = (uv_fs_t *)(local_1f0 + 0x18);
    puVar6 = (uv_fs_t *)0x0;
    iVar3 = uv_fs_copyfile(0,req_01,"test/fixtures/load_error.node","test_file_dst",0,0);
    if (local_1d8.result != 0xfffffffffffffff3) goto LAB_00158d46;
    if (iVar3 == -0xd) {
      uv_fs_req_cleanup(local_1f0 + 0x18);
      unlink("test_file_dst");
      return 0;
    }
  }
  else {
    run_test_fs_copyfile_cold_1();
LAB_00158cdc:
    run_test_fs_copyfile_cold_2();
LAB_00158ce1:
    run_test_fs_copyfile_cold_3();
LAB_00158ce6:
    run_test_fs_copyfile_cold_21();
LAB_00158ceb:
    run_test_fs_copyfile_cold_4();
LAB_00158cf0:
    run_test_fs_copyfile_cold_5();
LAB_00158cfd:
    puVar6 = (uv_fs_t *)local_1f0;
    run_test_fs_copyfile_cold_6();
LAB_00158d0a:
    run_test_fs_copyfile_cold_7();
LAB_00158d0f:
    run_test_fs_copyfile_cold_8();
LAB_00158d14:
    run_test_fs_copyfile_cold_9();
    name = (code *)unaff_R15;
LAB_00158d19:
    run_test_fs_copyfile_cold_10();
LAB_00158d1e:
    run_test_fs_copyfile_cold_11();
LAB_00158d23:
    run_test_fs_copyfile_cold_12();
LAB_00158d28:
    run_test_fs_copyfile_cold_13();
LAB_00158d2d:
    run_test_fs_copyfile_cold_14();
LAB_00158d32:
    run_test_fs_copyfile_cold_15();
LAB_00158d37:
    run_test_fs_copyfile_cold_16();
LAB_00158d3c:
    run_test_fs_copyfile_cold_17();
LAB_00158d41:
    run_test_fs_copyfile_cold_18();
LAB_00158d46:
    run_test_fs_copyfile_cold_19();
  }
  run_test_fs_copyfile_cold_20();
  pcVar8 = (code *)auStack_3e0;
  pcStack_408 = (code *)0x158d83;
  puStack_228 = (uv_fs_t *)req_00;
  pcStack_220 = unaff_R12;
  uVar4 = uv_fs_open(0,pcVar8,puVar6,0x241,0x180,0);
  pcStack_408 = (code *)0x158d8d;
  pcVar7 = pcVar8;
  uv_fs_req_cleanup();
  if ((int)uVar4 < 0) {
LAB_00158e32:
    pcStack_408 = (code *)0x158e37;
    touch_file_cold_1();
  }
  else {
    pcStack_408 = (code *)0x158da6;
    auStack_3f0 = uv_buf_init("a",1);
    if ((int)req_01 != 0) {
      pcVar8 = (code *)0x0;
      name = (code *)auStack_3e0;
      unaff_R12 = auStack_3f0;
      do {
        uStack_400 = 0;
        pcStack_408 = (code *)0x158de4;
        iVar3 = uv_fs_write(0,name,uVar4,unaff_R12,1,pcVar8);
        pcStack_408 = (code *)0x158dee;
        pcVar7 = name;
        uv_fs_req_cleanup();
        if (iVar3 < 0) {
          pcStack_408 = (code *)0x158e32;
          touch_file_cold_2();
          goto LAB_00158e32;
        }
        pcVar8 = pcVar8 + 1;
      } while ((code *)((ulong)req_01 & 0xffffffff) != pcVar8);
    }
    pcVar8 = (code *)auStack_3e0;
    pcStack_408 = (code *)0x158e0d;
    uVar4 = uv_fs_close(0,pcVar8,uVar4,0);
    pcStack_408 = (code *)0x158e17;
    pcVar7 = pcVar8;
    iVar3 = uv_fs_req_cleanup();
    if (uVar4 == 0) {
      return iVar3;
    }
  }
  uVar5 = (ulong)uVar4;
  pcStack_408 = handle_result;
  touch_file_cold_3();
  uStack_420 = uVar5;
  pcStack_418 = unaff_R12;
  pcStack_410 = pcVar8;
  pcStack_408 = name;
  if (*(int *)(pcVar7 + 0x40) == 0x1d) {
    if (*(long *)(pcVar7 + 0x58) != 0) goto LAB_00158eda;
    iVar3 = uv_fs_stat(0,auStack_5d8,*(undefined8 *)(pcVar7 + 0x68),0);
    lVar2 = lStack_530;
    lVar1 = lStack_560;
    if (iVar3 != 0) goto LAB_00158edf;
    uv_fs_req_cleanup(auStack_5d8);
    iVar3 = uv_fs_stat(0,auStack_5d8,"test_file_dst",0);
    if (iVar3 != 0) goto LAB_00158ee4;
    if (lStack_530 == lVar2) {
      if (lStack_560 == lVar1) {
        uv_fs_req_cleanup(auStack_5d8);
        iVar3 = uv_fs_req_cleanup(pcVar7);
        result_check_count = result_check_count + 1;
        return iVar3;
      }
      goto LAB_00158eee;
    }
  }
  else {
    handle_result_cold_1();
LAB_00158eda:
    handle_result_cold_2();
LAB_00158edf:
    handle_result_cold_3();
LAB_00158ee4:
    handle_result_cold_4();
  }
  handle_result_cold_5();
LAB_00158eee:
  handle_result_cold_6();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-fs-copyfile.c"
          ,0x2a,"fail_cb should not have been called");
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(fs_copyfile) {
#if defined(__ASAN__)
  RETURN_SKIP("Test does not currently work in ASAN");
#endif
  const char src[] = "test_file_src";
  uv_loop_t* loop;
  uv_fs_t req;
  int r;

  loop = uv_default_loop();

  /* Fails with EINVAL if bad flags are passed. */
  r = uv_fs_copyfile(NULL, &req, src, dst, -1, NULL);
  ASSERT(r == UV_EINVAL);
  uv_fs_req_cleanup(&req);

  /* Fails with ENOENT if source does not exist. */
  unlink(src);
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(req.result == UV_ENOENT);
  ASSERT(r == UV_ENOENT);
  uv_fs_req_cleanup(&req);
  /* The destination should not exist. */
  r = uv_fs_stat(NULL, &req, dst, NULL);
  ASSERT(r != 0);
  uv_fs_req_cleanup(&req);

  /* Succeeds if src and dst files are identical. */
  touch_file(src, 12);
  r = uv_fs_copyfile(NULL, &req, src, src, 0, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);
  /* Verify that the src file did not get truncated. */
  r = uv_fs_stat(NULL, &req, src, NULL);
  ASSERT_EQ(r, 0);
  ASSERT_EQ(req.statbuf.st_size, 12);
  uv_fs_req_cleanup(&req);
  unlink(src);

  /* Copies file synchronously. Creates new file. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies a file of size zero. */
  unlink(dst);
  touch_file(src, 0);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies file synchronously. Overwrites existing file. */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Fails to overwrites existing file. */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_EXCL, NULL);
  ASSERT(r == UV_EEXIST);
  uv_fs_req_cleanup(&req);

  /* Truncates when an existing destination is larger than the source file. */
  touch_file(src, 1);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies a larger file. */
  unlink(dst);
  touch_file(src, 4096 * 2);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT(r == 0);
  handle_result(&req);
  unlink(src);

  /* Copies file asynchronously */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, 0, handle_result);
  ASSERT(r == 0);
  ASSERT(result_check_count == 5);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(result_check_count == 6);

  /* If the flags are invalid, the loop should not be kept open */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, -1, fail_cb);
  ASSERT(r == UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);

  /* Copies file using UV_FS_COPYFILE_FICLONE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE, NULL);
  ASSERT(r == 0);
  handle_result(&req);

  /* Copies file using UV_FS_COPYFILE_FICLONE_FORCE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE_FORCE,
                     NULL);
  ASSERT(r <= 0);

  if (r == 0)
    handle_result(&req);

#ifndef _WIN32
  /* Copying respects permissions/mode. */
  unlink(dst);
  touch_file(dst, 0);
  chmod(dst, S_IRUSR|S_IRGRP|S_IROTH); /* Sets file mode to 444 (read-only). */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  /* On IBMi PASE, qsecofr users can overwrite read-only files */
# ifndef __PASE__
  ASSERT(req.result == UV_EACCES);
  ASSERT(r == UV_EACCES);
# endif
  uv_fs_req_cleanup(&req);
#endif

  unlink(dst); /* Cleanup */
  return 0;
}